

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

int Vec_IntPushUniqueOrder(Vec_Int_t *p,int Entry)

{
  uint uVar1;
  bool bVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = p->nSize;
  uVar6 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    piVar3 = p->pArray;
    uVar5 = 0;
    do {
      if (piVar3[uVar5] == Entry) goto LAB_00897fbc;
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  if (uVar1 == p->nCap) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(0x40);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,0x40);
      }
      p->pArray = piVar3;
      iVar4 = 0x10;
      if (piVar3 == (int *)0x0) {
LAB_00897fc2:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
    }
    else {
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(uVar6 * 8);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,uVar6 * 8);
      }
      p->pArray = piVar3;
      if (piVar3 == (int *)0x0) goto LAB_00897fc2;
      iVar4 = uVar1 * 2;
    }
    p->nCap = iVar4;
    uVar6 = (ulong)(uint)p->nSize;
  }
  else {
    piVar3 = p->pArray;
  }
  p->nSize = (int)uVar6 + 1;
  if (0 < (int)uVar6) {
    do {
      if (piVar3[uVar6 - 1] <= Entry) goto LAB_00897fb6;
      piVar3[uVar6] = piVar3[uVar6 - 1];
      bVar2 = 1 < uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar2);
    uVar6 = 0;
  }
LAB_00897fb6:
  piVar3[(int)uVar6] = Entry;
LAB_00897fbc:
  return (int)piVar3;
}

Assistant:

static inline int Vec_IntPushUniqueOrder( Vec_Int_t * p, int Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Vec_IntPushOrder( p, Entry );
    return 0;
}